

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  upb_key tabkey;
  uint uVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t hash;
  lookupkey_t key;
  upb_value val;
  intptr_t iter;
  upb_StringView sv;
  upb_strtable new_table;
  
  iVar4 = init((EVP_PKEY_CTX *)&new_table);
  if ((char)iVar4 != '\0') {
    iter = -1;
    while( true ) {
      _Var3 = upb_strtable_next2(t,&sv,&val,&iter);
      pcVar2 = sv.data;
      if (!_Var3) break;
      uVar1 = *(uint *)(sv.data + -4);
      if (sv.size != uVar1) {
        __assert_fail("keystr->size == sv.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x1eb,"_Bool upb_strtable_resize(upb_strtable *, size_t, upb_Arena *)");
      }
      tabkey.str = (upb_SizePrefixString *)(sv.data + -4);
      hash = _upb_Hash_NoSeed(sv.data,(ulong)uVar1);
      key.str.size._0_4_ = uVar1;
      key.str.data = pcVar2;
      key.str.size._4_4_ = 0;
      insert(&new_table.t,key,tabkey,val,hash,strhash,streql);
    }
    (t->t).entries = new_table.t.entries;
    (t->t).count = new_table.t.count;
    (t->t).mask = new_table.t.mask;
  }
  return (_Bool)(char)iVar4;
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView sv;
  upb_value val;
  while (upb_strtable_next2(t, &sv, &val, &iter)) {
    // Unlike normal insert, does not copy string data or possibly reallocate
    // the table
    // The data pointer used in the table is guaranteed to point at a
    // upb_SizePrefixString, we just need to back up by the size of the uint32_t
    // length prefix.
    const upb_SizePrefixString* keystr =
        (const upb_SizePrefixString*)(sv.data - sizeof(uint32_t));
    UPB_ASSERT(keystr->data == sv.data);
    UPB_ASSERT(keystr->size == sv.size);

    lookupkey_t lookupkey = {.str = sv};
    upb_key tabkey = {.str = keystr};
    uint32_t hash = _upb_Hash_NoSeed(sv.data, sv.size);
    insert(&new_table.t, lookupkey, tabkey, val, hash, &strhash, &streql);
  }
  *t = new_table;
  return true;
}